

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# klibexec.h
# Opt level: O3

kbool_t KRuntime_tryCallMethod(KonohaContext *kctx,KonohaStack *sfp)

{
  KRuntimeContextVar *pKVar1;
  KonohaStack *pKVar2;
  kArray *pkVar3;
  ulong uVar4;
  int iVar5;
  __jmp_buf_tag *__src;
  KRuntimeContextVar *pKVar6;
  KTraceInfo traceREF_;
  KTraceInfo local_f8 [8];
  
  pKVar1 = kctx->stack;
  pKVar2 = pKVar1->bottomStack;
  __src = *pKVar1->evaljmpbuf;
  pKVar6 = pKVar1;
  if (__src == (__jmp_buf_tag *)0x0) {
    local_f8[0].pline = *(kfileline_t *)&sfp[-4].field_1;
    local_f8[0].errorSymbol = 0;
    local_f8[0].faultType = 0;
    local_f8[0].baseStack = sfp;
    __src = (__jmp_buf_tag *)(*(kctx->platApi->GCModule).Kzmalloc)(kctx,200,local_f8);
    pKVar1->evaljmpbuf = (jmp_buf *)__src;
    pKVar6 = kctx->stack;
  }
  memcpy(local_f8,__src,200);
  pKVar1->bottomStack = sfp;
  pKVar1->ThrownException = (kException *)kctx->share->constNull;
  pkVar3 = pKVar6->gcStack;
  uVar4 = pkVar3->bytesize;
  iVar5 = (*kctx->platApi->setjmp_i)(__src);
  if (iVar5 == 0) {
    sfp[-3].field_1 = (anon_union_8_10_3f923e25_for_KonohaValueVar_2)kctx->stack->topStack;
    kctx->stack->topStack = sfp;
    (*(sfp[-1].field_1.calledMethod)->invokeKMethodFunc)(kctx,sfp);
    kctx->stack->topStack = (KonohaStack *)sfp[-3].field_1;
  }
  else {
    (*(kctx->platApi->ConsoleModule).ReportCaughtException)
              (kctx,pKVar1->ThrownException,pKVar1->bottomStack,pKVar1->topStack);
  }
  (*kctx->klib->kArray_Clear)(kctx,pkVar3,uVar4 >> 3);
  pKVar1->bottomStack = pKVar2;
  memcpy(pKVar1->evaljmpbuf,local_f8,200);
  return iVar5 == 0;
}

Assistant:

static kbool_t KRuntime_tryCallMethod(KonohaContext *kctx, KonohaStack *sfp)
{
	KRuntimeContextVar *runtime = kctx->stack;
	KonohaStack *bottomStack = runtime->bottomStack;
	jmpbuf_i lbuf = {};
	if(runtime->evaljmpbuf == NULL) {
		KMakeTrace(trace, sfp);
		runtime->evaljmpbuf = (jmpbuf_i *)KCalloc(sizeof(jmpbuf_i), 1, trace);
	}
	memcpy(&lbuf, runtime->evaljmpbuf, sizeof(jmpbuf_i));
	runtime->bottomStack = sfp;
	KUnsafeFieldSet(runtime->ThrownException, (kException *)K_NULL);
	kbool_t result = true;
	int jumpResult;
	INIT_GCSTACK();
	if((jumpResult = PLATAPI setjmp_i(*runtime->evaljmpbuf)) == 0) {
		KStackCall(sfp);
	}
	else {
		PLATAPI ConsoleModule.ReportCaughtException(kctx, runtime->ThrownException, runtime->bottomStack, runtime->topStack);
		result = false;
	}
	RESET_GCSTACK();
	runtime->bottomStack = bottomStack;
	memcpy(runtime->evaljmpbuf, &lbuf, sizeof(jmpbuf_i));
	return result;
}